

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O1

void __thiscall
llbuild::buildsystem::BuildSystemInvocation::parse
          (BuildSystemInvocation *this,
          ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          args,SourceMgr *sourceMgr)

{
  size_type *psVar1;
  pointer pcVar2;
  bool bVar3;
  BuildSystemInvocation *pBVar4;
  int iVar5;
  long *plVar6;
  undefined8 *puVar7;
  long lVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  size_type sVar10;
  size_type sVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  string *psVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> algorithm;
  char *end;
  anon_class_16_2_f26e8178 error;
  char *end_1;
  Child local_108;
  long local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  BuildSystemInvocation *local_c8;
  anon_class_16_2_f26e8178 local_c0;
  Child local_b0;
  long local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  string *local_90;
  Child local_88;
  undefined8 uStack_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  string *local_68;
  string *local_60;
  string *local_58;
  char *local_50;
  Twine local_48;
  
  sVar10 = args.Length;
  __x = args.Data;
  local_68 = (string *)&this->traceFilePath;
  local_60 = (string *)&this->buildFilePath;
  local_58 = (string *)&this->chdirPath;
  local_90 = (string *)&this->dbPath;
  local_c8 = this;
  local_c0.sourceMgr = sourceMgr;
  local_c0.this = this;
  do {
    if (sVar10 == 0) {
      return;
    }
    sVar11 = sVar10 - 1;
    __rhs = __x + 1;
    iVar5 = std::__cxx11::string::compare((char *)__x);
    if (iVar5 == 0) {
      lVar8 = sVar10 * 0x20;
      bVar3 = true;
      sVar10 = sVar11;
      __x = __rhs;
      if (lVar8 != 0x20) {
        lVar8 = lVar8 + -0x20;
        __x_00 = __rhs;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->positionalArgs,__x_00);
          __x_00 = __x_00 + 1;
          lVar8 = lVar8 + -0x20;
        } while (lVar8 != 0);
      }
      goto LAB_001a996f;
    }
    if ((__x->_M_string_length != 0) && (*(__x->_M_dataplus)._M_p != '-')) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->positionalArgs,__x);
      goto LAB_001a9956;
    }
    iVar5 = std::__cxx11::string::compare((char *)__x);
    if (iVar5 == 0) {
      local_c8->showUsage = true;
LAB_001a996d:
      bVar3 = true;
      sVar10 = sVar11;
      __x = __rhs;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)__x);
      if (iVar5 == 0) {
        local_c8->showVersion = true;
        goto LAB_001a996d;
      }
      iVar5 = std::__cxx11::string::compare((char *)__x);
      if (iVar5 == 0) {
        bVar3 = false;
        std::__cxx11::string::_M_replace
                  ((ulong)local_90,0,(char *)(local_c8->dbPath)._M_string_length,0x201413);
        sVar10 = sVar11;
        __x = __rhs;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)__x);
        psVar12 = local_90;
        if ((((iVar5 == 0) ||
             (iVar5 = std::__cxx11::string::compare((char *)__x), psVar12 = local_58, iVar5 == 0))
            || (iVar5 = std::__cxx11::string::compare((char *)__x), psVar12 = local_58, iVar5 == 0))
           || (iVar5 = std::__cxx11::string::compare((char *)__x), psVar12 = local_60, iVar5 == 0))
        {
          if (sVar11 == 0) {
            std::operator+(&local_e8,"missing argument to \'",__x);
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_e8);
            paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(puVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar7 == paVar9) {
              local_f8._M_allocated_capacity = paVar9->_M_allocated_capacity;
              local_f8._8_8_ = puVar7[3];
              local_108.twine = (Twine *)&local_f8;
            }
            else {
              local_f8._M_allocated_capacity = paVar9->_M_allocated_capacity;
              local_108.twine = (Twine *)*puVar7;
            }
            local_100 = puVar7[1];
            *puVar7 = paVar9;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            llvm::Twine::Twine((Twine *)&local_b0,(string *)&local_108);
            pBVar4 = local_c0.this;
            local_88.twine = (Twine *)0x0;
            uStack_80 = 0;
            llvm::SourceMgr::PrintMessage
                      (local_c0.sourceMgr,(SMLoc)0x0,DK_Error,(Twine *)&local_b0,
                       (ArrayRef<llvm::SMRange>)ZEXT816(0),(ArrayRef<llvm::SMFixIt>)ZEXT816(0),true)
            ;
            pBVar4->hadErrors = true;
            if (local_108.twine != (Twine *)&local_f8) {
              operator_delete(local_108.twine,local_f8._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p == &local_e8.field_2) goto LAB_001a996d;
LAB_001a9acd:
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            goto LAB_001a996d;
          }
LAB_001a99c4:
          std::__cxx11::string::_M_assign(psVar12);
LAB_001a99cc:
          bVar3 = false;
          sVar10 = sVar10 - 2;
          __x = __x + 2;
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)__x);
          if (iVar5 == 0) {
            local_c8->useSerialBuild = true;
            goto LAB_001a9956;
          }
          iVar5 = std::__cxx11::string::compare((char *)__x);
          if (iVar5 != 0) {
            iVar5 = std::__cxx11::string::compare((char *)__x);
            if ((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)__x), iVar5 == 0)) {
              if (sVar11 != 0) {
                lVar8 = strtol((__rhs->_M_dataplus)._M_p,&local_50,10);
                local_c8->schedulerLanes = (uint32_t)lVar8;
                if (*local_50 != '\0') {
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_88,"invalid argument \'",__rhs);
                  plVar6 = (long *)std::__cxx11::string::append(&local_88.character);
                  local_b0.twine = (Twine *)&local_a0;
                  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(plVar6 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar6 == paVar9) {
                    local_a0._M_allocated_capacity = paVar9->_M_allocated_capacity;
                    local_a0._8_8_ = plVar6[3];
                  }
                  else {
                    local_a0._M_allocated_capacity = paVar9->_M_allocated_capacity;
                    local_b0.twine = (Twine *)*plVar6;
                  }
                  local_a8 = plVar6[1];
                  *plVar6 = (long)paVar9;
                  plVar6[1] = 0;
                  *(undefined1 *)(plVar6 + 2) = 0;
                  std::operator+(&local_e8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_b0,__x);
                  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_e8);
                  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(puVar7 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar7 == paVar9) {
                    local_f8._M_allocated_capacity = paVar9->_M_allocated_capacity;
                    local_f8._8_8_ = puVar7[3];
                    local_108.twine = (Twine *)&local_f8;
                  }
                  else {
                    local_f8._M_allocated_capacity = paVar9->_M_allocated_capacity;
                    local_108.twine = (Twine *)*puVar7;
                  }
                  local_100 = puVar7[1];
                  *puVar7 = paVar9;
                  puVar7[1] = 0;
                  *(undefined1 *)(puVar7 + 2) = 0;
                  llvm::Twine::Twine(&local_48,(string *)&local_108);
                  parse::anon_class_16_2_f26e8178::operator()(&local_c0,&local_48);
                  if (local_108.twine != (Twine *)&local_f8) {
                    operator_delete(local_108.twine,local_f8._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                    operator_delete(local_e8._M_dataplus._M_p,
                                    local_e8.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b0.twine != &local_a0) {
                    operator_delete(local_b0.twine,local_a0._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_88.twine != &local_78) {
                    operator_delete(local_88.twine,local_78._M_allocated_capacity + 1);
                  }
                }
                goto LAB_001a99cc;
              }
              goto LAB_001a9e22;
            }
            if ((__x->_M_string_length < 2) || (*(short *)(__x->_M_dataplus)._M_p != 0x6a2d)) {
              iVar5 = std::__cxx11::string::compare((char *)__x);
              if ((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)__x), iVar5 != 0))
              {
                iVar5 = std::__cxx11::string::compare((char *)__x);
                if (iVar5 == 0) {
                  psVar12 = local_68;
                  if (sVar11 != 0) goto LAB_001a99c4;
                  goto LAB_001a9e22;
                }
                std::operator+(&local_e8,"invalid option \'",__x);
                plVar6 = (long *)std::__cxx11::string::append((char *)&local_e8);
                paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(plVar6 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar6 == paVar9) {
                  local_f8._M_allocated_capacity = paVar9->_M_allocated_capacity;
                  local_f8._8_8_ = plVar6[3];
                  local_108.twine = (Twine *)&local_f8;
                }
                else {
                  local_f8._M_allocated_capacity = paVar9->_M_allocated_capacity;
                  local_108.twine = (Twine *)*plVar6;
                }
                goto LAB_001a9e78;
              }
              local_c8->showVerboseStatus = true;
            }
            else {
              lVar8 = strtol((__x->_M_dataplus)._M_p + 2,(char **)&local_e8,10);
              local_c8->schedulerLanes = (uint32_t)lVar8;
              if (*local_e8._M_dataplus._M_p != '\0') {
                llvm::Twine::Twine((Twine *)&local_108,"invalid argument to \'-j\'");
                parse::anon_class_16_2_f26e8178::operator()(&local_c0,(Twine *)&local_108);
              }
            }
LAB_001a9956:
            bVar3 = false;
            sVar10 = sVar11;
            __x = __rhs;
            goto LAB_001a996f;
          }
          if (sVar11 == 0) {
LAB_001a9e22:
            std::operator+(&local_e8,"missing argument to \'",__x);
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_e8);
            local_108.twine = (Twine *)&local_f8;
            paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 == paVar9) {
              local_f8._M_allocated_capacity = paVar9->_M_allocated_capacity;
              local_f8._8_8_ = plVar6[3];
            }
            else {
              local_f8._M_allocated_capacity = paVar9->_M_allocated_capacity;
              local_108.twine = (Twine *)*plVar6;
            }
LAB_001a9e78:
            local_100 = plVar6[1];
            *plVar6 = (long)paVar9;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            llvm::Twine::Twine((Twine *)&local_b0,(string *)&local_108);
            parse::anon_class_16_2_f26e8178::operator()(&local_c0,(Twine *)&local_b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108.twine != &local_f8) {
              operator_delete(local_108.twine,local_f8._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p == &local_e8.field_2) goto LAB_001a996d;
            goto LAB_001a9acd;
          }
          local_108.twine = (Twine *)&local_f8;
          pcVar2 = __x[1]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_108,pcVar2,pcVar2 + __x[1]._M_string_length);
          iVar5 = std::__cxx11::string::compare(&local_108.character);
          if ((iVar5 == 0) ||
             (iVar5 = std::__cxx11::string::compare(&local_108.character), iVar5 == 0)) {
            local_c8->schedulerAlgorithm = NamePriority;
LAB_001a9c4d:
            sVar11 = sVar10 - 2;
            __rhs = __x + 2;
            bVar3 = false;
          }
          else {
            iVar5 = std::__cxx11::string::compare(&local_108.character);
            if (iVar5 == 0) {
              local_c8->schedulerAlgorithm = FIFO;
              goto LAB_001a9c4d;
            }
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_b0,"unknown scheduler algorithm \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_108);
            plVar6 = (long *)std::__cxx11::string::append(&local_b0.character);
            psVar1 = (size_type *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar1) {
              local_e8.field_2._M_allocated_capacity = *psVar1;
              local_e8.field_2._8_8_ = plVar6[3];
              local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            }
            else {
              local_e8.field_2._M_allocated_capacity = *psVar1;
              local_e8._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_e8._M_string_length = plVar6[1];
            *plVar6 = (long)psVar1;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            llvm::Twine::Twine((Twine *)&local_88,&local_e8);
            parse::anon_class_16_2_f26e8178::operator()(&local_c0,(Twine *)&local_88);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.twine != &local_a0) {
              operator_delete(local_b0.twine,local_a0._M_allocated_capacity + 1);
            }
            bVar3 = true;
          }
          sVar10 = sVar11;
          __x = __rhs;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108.twine != &local_f8) {
            operator_delete(local_108.twine,local_f8._M_allocated_capacity + 1);
          }
        }
      }
    }
LAB_001a996f:
    if (bVar3) {
      return;
    }
  } while( true );
}

Assistant:

void BuildSystemInvocation::parse(llvm::ArrayRef<std::string> args,
                                  llvm::SourceMgr& sourceMgr) {
  auto error = [&](const Twine &message) {
    sourceMgr.PrintMessage(llvm::SMLoc{}, llvm::SourceMgr::DK_Error, message);
    hadErrors = true;
  };

  while (!args.empty()) {
    const auto& option = args.front();
    args = args.slice(1);

    if (option == "-") {
      for (const auto& arg: args) {
        positionalArgs.push_back(arg);
      }
      break;
    }

    if (!option.empty() && option[0] != '-') {
      positionalArgs.push_back(option);
      continue;
    }
    
    if (option == "--help") {
      showUsage = true;
      break;
    } else if (option == "--version") {
      showVersion = true;
      break;
    } else if (option == "--no-db") {
      dbPath = "";
    } else if (option == "--db") {
      if (args.empty()) {
        error("missing argument to '" + option + "'");
        break;
      }
      dbPath = args[0];
      args = args.slice(1);
    } else if (option == "-C" || option == "--chdir") {
      if (args.empty()) {
        error("missing argument to '" + option + "'");
        break;
      }
      chdirPath = args[0];
      args = args.slice(1);
    } else if (option == "-f") {
      if (args.empty()) {
        error("missing argument to '" + option + "'");
        break;
      }
      buildFilePath = args[0];
      args = args.slice(1);
    } else if (option == "--serial") {
      useSerialBuild = true;
    } else if (option == "--scheduler") {
      if (args.empty()) {
        error("missing argument to '" + option + "'");
        break;
      }
      auto algorithm = args[0];
      if (algorithm == "commandNamePriority" || algorithm == "default") {
        schedulerAlgorithm = SchedulerAlgorithm::NamePriority;
      } else if (algorithm == "fifo") {
        schedulerAlgorithm = SchedulerAlgorithm::FIFO;
      } else {
        error("unknown scheduler algorithm '" + algorithm + "'");
        break;
      }
      args = args.slice(1);
    } else if (option == "-j" || option == "--jobs") {
      if (args.empty()) {
        error("missing argument to '" + option + "'");
        break;
      }
      char *end;
      schedulerLanes = ::strtol(args[0].c_str(), &end, 10);
      if (*end != '\0') {
        error("invalid argument '" + args[0] + "' to '" + option + "'");
      }
      args = args.slice(1);
    } else if (StringRef(option).startswith("-j")) {
      char *end;
      schedulerLanes = ::strtol(&option[2], &end, 10);
      if (*end != '\0') {
        error("invalid argument to '-j'");
      }
    } else if (option == "-v" || option == "--verbose") {
      showVerboseStatus = true;
    } else if (option == "--trace") {
      if (args.empty()) {
        error("missing argument to '" + option + "'");
        break;
      }
      traceFilePath = args[0];
      args = args.slice(1);
    } else {
      error("invalid option '" + option + "'");
      break;
    }
  }
}